

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaSSModel.cpp
# Opt level: O2

void __thiscall NaStateSpaceModel::Function(NaStateSpaceModel *this,NaReal *pU,NaReal *pY)

{
  NaVector *rArg;
  uint uVar1;
  NaReal *pNVar2;
  EVP_PKEY_CTX *src;
  uint i;
  ulong uVar3;
  NaVector y;
  NaVector u;
  NaVector y1;
  NaVector x2;
  NaVector x1;
  NaVector local_90;
  NaVector local_78;
  NaVector local_60;
  NaVector local_48;
  NaVector local_30;
  
  NaVector::NaVector(&local_78,this->k);
  NaVector::NaVector(&local_90,this->m);
  NaVector::operator=(&local_78,pU);
  NaVector::NaVector(&local_30,this->n);
  NaVector::NaVector(&local_48,this->n);
  NaVector::NaVector(&local_60,this->m);
  rArg = &this->x;
  NaMatrix::multiply(&this->C,rArg,&local_90);
  NaMatrix::multiply(&this->D,&local_78,&local_60);
  NaVector::add(&local_90,&local_60);
  NaMatrix::multiply(&this->A,rArg,&local_30);
  NaMatrix::multiply(&this->B,&local_78,&local_48);
  NaVector::copy(rArg,(EVP_PKEY_CTX *)&local_30,src);
  NaVector::add(rArg,&local_48);
  if (pY != (NaReal *)0x0) {
    uVar3 = 0;
    while( true ) {
      uVar1 = NaVector::dim(&local_90);
      if (uVar1 <= uVar3) break;
      pNVar2 = NaVector::operator[](&local_90,(uint)uVar3);
      pY[uVar3] = *pNVar2;
      uVar3 = uVar3 + 1;
    }
  }
  NaVector::~NaVector(&local_60);
  NaVector::~NaVector(&local_48);
  NaVector::~NaVector(&local_30);
  NaVector::~NaVector(&local_90);
  NaVector::~NaVector(&local_78);
  return;
}

Assistant:

void
NaStateSpaceModel::Function (NaReal* pU, NaReal* pY)
{
    NaVector	u(k), y(m);
    u = pU;

    NaVector    x1(n), x2(n), y1(m);

    // y(t) = C*x(t) + D*u(t)
    C.multiply(x, y);            // y = C * x
    D.multiply(u, y1);           // y1 = D * u
    y.add(y1);                   // y += y1

    // x(t+1) = A*x(t) + B*u(t)
    A.multiply(x, x1);           // x1 = A * x
    B.multiply(u, x2);           // x2 = B * u
    x.copy(x1);                  // x = x1
    x.add(x2);                   // x += x2

    if(pY != NULL) {
	for(unsigned i = 0; i < y.dim(); ++i)
	    pY[i] = y[i];
    }
}